

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v11::detail::do_format_base2e<char,unsigned_long>
                 (int base_bits,char *out,unsigned_long value,int size,bool upper)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  undefined7 in_register_00000081;
  
  pcVar1 = out + size;
  pcVar2 = "0123456789abcdef";
  if ((int)CONCAT71(in_register_00000081,upper) != 0) {
    pcVar2 = "0123456789ABCDEF";
  }
  do {
    uVar4 = (uint)value & ~(-1 << ((byte)base_bits & 0x1f));
    if (base_bits < 4) {
      cVar3 = (char)uVar4 + '0';
    }
    else {
      cVar3 = pcVar2[uVar4];
    }
    pcVar1[-1] = cVar3;
    pcVar1 = pcVar1 + -1;
    value = value >> ((byte)base_bits & 0x3f);
  } while (value != 0);
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR auto do_format_base2e(int base_bits, Char* out, UInt value,
                                    int size, bool upper = false) -> Char* {
  out += size;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << base_bits) - 1));
    *--out = static_cast<Char>(base_bits < 4 ? static_cast<char>('0' + digit)
                                             : digits[digit]);
  } while ((value >>= base_bits) != 0);
  return out;
}